

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
__thiscall pstore::broker::command_processor::parse(command_processor *this,message_type *msg)

{
  mutex_type *in_RDX;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  message_type *msg_local;
  command_processor *this_local;
  
  lock._M_device = in_RDX;
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)&msg[1].part_no);
  broker::parse((broker *)this,(message_type *)lock._M_device,
                (partial_cmds *)(msg[1].payload._M_elems + 0x24));
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return (__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
          )(__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
            )this;
}

Assistant:

auto command_processor::parse (brokerface::message_type const & msg)
            -> std::unique_ptr<broker_command> {
            std::lock_guard<decltype (cmds_mut_)> const lock{cmds_mut_};
            return ::pstore::broker::parse (msg, cmds_);
        }